

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  Schema *pSVar1;
  HashElem *pHVar2;
  int iVar3;
  Parse *local_50;
  Trigger *local_48;
  Trigger *pTrig;
  HashElem *p;
  Trigger *pList;
  Schema *pTmpSchema;
  Table *pTab_local;
  Parse *pParse_local;
  
  pSVar1 = pParse->db->aDb[1].pSchema;
  p = (HashElem *)0x0;
  if (pParse->disableTriggers == '\0') {
    if (pSVar1 != pTab->pSchema) {
      for (pTrig = (Trigger *)(pSVar1->trigHash).first; pTrig != (Trigger *)0x0;
          pTrig = (Trigger *)pTrig->zName) {
        pHVar2 = *(HashElem **)&pTrig->op;
        if (((Schema *)pHVar2[1].data == pTab->pSchema) &&
           (iVar3 = sqlite3StrICmp((char *)pHVar2->prev,pTab->zName), iVar3 == 0)) {
          if (p == (HashElem *)0x0) {
            local_48 = pTab->pTrigger;
          }
          else {
            local_48 = (Trigger *)p;
          }
          pHVar2[2].next = (HashElem *)local_48;
          p = pHVar2;
        }
      }
    }
    if (p == (HashElem *)0x0) {
      local_50 = (Parse *)pTab->pTrigger;
    }
    else {
      local_50 = (Parse *)p;
    }
    pParse_local = local_50;
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (Trigger *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema * const pTmpSchema = pParse->db->aDb[1].pSchema;
  Trigger *pList = 0;                  /* List of triggers to return */

  if( pParse->disableTriggers ){
    return 0;
  }

  if( pTmpSchema!=pTab->pSchema ){
    HashElem *p;
    assert( sqlite3SchemaMutexHeld(pParse->db, 0, pTmpSchema) );
    for(p=sqliteHashFirst(&pTmpSchema->trigHash); p; p=sqliteHashNext(p)){
      Trigger *pTrig = (Trigger *)sqliteHashData(p);
      if( pTrig->pTabSchema==pTab->pSchema
       && 0==sqlite3StrICmp(pTrig->table, pTab->zName) 
      ){
        pTrig->pNext = (pList ? pList : pTab->pTrigger);
        pList = pTrig;
      }
    }
  }

  return (pList ? pList : pTab->pTrigger);
}